

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O3

void __thiscall
DivideTest<long>::test_random_numerators<(libdivide::Branching)1>
          (DivideTest<long> *this,long denom,divider<long,_(libdivide::Branching)1> *the_divider)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  lVar4 = 0;
  do {
    lVar6 = 8;
    do {
      uVar2 = this->seed * 0x19660d + 0x3c6ef35f;
      this->seed = uVar2;
      uVar1 = this->rand_n;
      uVar5 = ((uVar2 & 1) + 1) * uVar1 + 3 + uVar1 % 0x1c9c381;
      uVar3 = (ulong)(uVar2 % 0x13);
      if (uVar1 <= uVar5) {
        uVar3 = uVar5;
      }
      this->rand_n = uVar3;
      uVar5 = -uVar3;
      if ((uVar2 & 1) == 0) {
        uVar5 = uVar3;
      }
      test_one<(libdivide::Branching)1>(this,uVar5,denom,the_divider);
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 10000);
  return;
}

Assistant:

void test_random_numerators(T denom, const divider<T, ALGO> &the_divider) {
        for (size_t i = 0; i < 10000; ++i) {
            for (size_t j = 0; j < min_vector_count; j++) {
                test_one(get_random(), denom, the_divider);
            }
        }
    }